

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointObservationDiscrete.cpp
# Opt level: O2

string * __thiscall
JointObservationDiscrete::SoftPrintBrief_abi_cxx11_
          (string *__return_storage_ptr__,JointObservationDiscrete *this)

{
  pointer ppOVar1;
  pointer ppOVar2;
  stringstream ss;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  ppOVar1 = (this->_m_opVector).
            super__Vector_base<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppOVar2 = (this->_m_opVector).
                 super__Vector_base<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppOVar2 != ppOVar1;
      ppOVar2 = ppOVar2 + 1) {
    if (*ppOVar2 != (ObservationDiscrete *)0x0) {
      (*((*ppOVar2)->super_Observation).super_NamedDescribedEntity._vptr_NamedDescribedEntity[3])
                (local_1d8);
      std::operator<<(local_1a8,local_1d8);
      std::__cxx11::string::~string(local_1d8);
    }
    if (ppOVar2 != ppOVar1 + -1) {
      std::operator<<(local_1a8,"_");
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string JointObservationDiscrete::SoftPrintBrief() const
{
    stringstream ss;
    vector<const ObservationDiscrete*>::const_iterator it =  _m_opVector.begin();
    vector<const ObservationDiscrete*>::const_iterator last =  _m_opVector.end();

    while(it != last)
    {
        if(*it != 0)
            ss << (*it)->SoftPrintBrief();
        if(it != last-1)
            ss << "_";

        it++;
    }
    return(ss.str());
}